

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O3

Aig_Man_t * Aig_ManSclPart(Aig_Man_t *pAig,int fLatchConst,int fLatchEqual,int fVerbose)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Int_t *vPart;
  uint uVar4;
  Vec_Ptr_t *__ptr;
  void **ppvVar5;
  int *piVar6;
  void *__dest;
  Aig_Man_t *pAVar7;
  Aig_Man_t *p;
  ulong uVar8;
  long lVar9;
  size_t __size;
  Vec_Vec_t *pVVar10;
  size_t __size_00;
  int iVar11;
  ulong uVar12;
  int local_68;
  int nCountPis;
  int *pMapBack;
  int local_54;
  int local_50;
  int nCountRegs;
  Vec_Ptr_t *local_48;
  Aig_Man_t *local_40;
  ulong local_38;
  
  uVar12 = (ulong)(uint)fVerbose;
  pVVar10 = pAig->vClockDoms;
  local_54 = fLatchConst;
  local_50 = fLatchEqual;
  local_40 = pAig;
  if (pVVar10 == (Vec_Vec_t *)0x0) {
    __ptr = Aig_ManRegPartitionSimple(pAig,0,0);
  }
  else {
    __ptr = (Vec_Ptr_t *)malloc(0x10);
    __ptr->nCap = 100;
    __ptr->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    __ptr->pArray = ppvVar5;
    if (0 < pVVar10->nSize) {
      local_68 = 100;
      __size = 0;
      iVar11 = 0;
      uVar8 = 0;
      local_48 = __ptr;
      local_38 = uVar12;
      do {
        pvVar3 = pVVar10->pArray[uVar8];
        piVar6 = (int *)malloc(0x10);
        iVar1 = *(int *)((long)pvVar3 + 4);
        piVar6[1] = iVar1;
        *piVar6 = iVar1;
        if ((long)iVar1 == 0) {
          __size_00 = 0;
          __dest = (void *)0x0;
        }
        else {
          __size_00 = (long)iVar1 << 2;
          __dest = malloc(__size_00);
        }
        *(void **)(piVar6 + 2) = __dest;
        memcpy(__dest,*(void **)((long)pvVar3 + 8),__size_00);
        __ptr = local_48;
        if ((int)uVar8 == local_68) {
          ppvVar5 = local_48->pArray;
          if (uVar8 < 0x10) {
            if (ppvVar5 == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(ppvVar5,0x80);
            }
            __ptr->pArray = ppvVar5;
            local_68 = 0x10;
          }
          else {
            if (ppvVar5 == (void **)0x0) {
              ppvVar5 = (void **)malloc(__size);
            }
            else {
              ppvVar5 = (void **)realloc(ppvVar5,__size);
            }
            __ptr->pArray = ppvVar5;
            local_68 = iVar11;
          }
        }
        else {
          ppvVar5 = local_48->pArray;
        }
        ppvVar5[uVar8] = piVar6;
        uVar8 = uVar8 + 1;
        pVVar10 = local_40->vClockDoms;
        iVar11 = iVar11 + 2;
        __size = __size + 0x10;
      } while ((long)uVar8 < (long)pVVar10->nSize);
      __ptr->nSize = (int)uVar8;
      __ptr->nCap = local_68;
      pAig = local_40;
      uVar12 = local_38;
    }
  }
  Aig_ManReprStart(pAig,pAig->vObjs->nSize);
  if (0 < __ptr->nSize) {
    uVar8 = 0;
    do {
      vPart = (Vec_Int_t *)__ptr->pArray[uVar8];
      pAVar7 = Aig_ManRegCreatePart(pAig,vPart,&nCountPis,&nCountRegs,&pMapBack);
      Aig_ManSetRegNum(pAVar7,pAVar7->nRegs);
      if (0 < nCountPis) {
        p = Aig_ManScl(pAVar7,local_54,local_50,0,-1,-1,(int)uVar12,0);
        uVar4 = Aig_TransferMappedClasses(pAig,pAVar7,pMapBack);
        if ((int)uVar12 != 0) {
          uVar2 = vPart->nSize;
          printf("%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d\n"
                 ,uVar8 & 0xffffffff,(ulong)uVar2,(ulong)(pAVar7->nObjs[2] - uVar2),
                 (ulong)(uint)nCountPis,(ulong)(uint)nCountRegs,
                 (ulong)(uint)(pAVar7->nObjs[6] + pAVar7->nObjs[5]),0,(ulong)uVar4);
        }
        Aig_ManStop(p);
        pAig = local_40;
      }
      Aig_ManStop(pAVar7);
      if (pMapBack != (int *)0x0) {
        free(pMapBack);
        pMapBack = (int *)0x0;
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)__ptr->nSize);
  }
  pAVar7 = Aig_ManDupRepr(pAig,0);
  Aig_ManSeqCleanup(pAVar7);
  iVar11 = __ptr->nSize;
  if (0 < iVar11) {
    lVar9 = 0;
    do {
      pvVar3 = __ptr->pArray[lVar9];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
        iVar11 = __ptr->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar11);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return pAVar7;
}

Assistant:

Aig_Man_t * Aig_ManSclPart( Aig_Man_t * pAig, int fLatchConst, int fLatchEqual, int fVerbose ) 
{
    Vec_Ptr_t * vResult;
    Vec_Int_t * vPart;
    int i, nCountPis, nCountRegs;
    int * pMapBack;
    Aig_Man_t * pTemp, * pNew;
    int nClasses;

    if ( pAig->vClockDoms ) 
    {
        vResult = Vec_PtrAlloc( 100 );
        Vec_PtrForEachEntry( Vec_Int_t *, (Vec_Ptr_t *)pAig->vClockDoms, vPart, i )
            Vec_PtrPush( vResult, Vec_IntDup(vPart) );
    } 
    else
        vResult = Aig_ManRegPartitionSimple( pAig, 0, 0 );

    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    Vec_PtrForEachEntry( Vec_Int_t *, vResult, vPart, i ) 
    {
        pTemp = Aig_ManRegCreatePart( pAig, vPart, &nCountPis, &nCountRegs, &pMapBack );
        Aig_ManSetRegNum( pTemp, pTemp->nRegs );
        if (nCountPis>0) 
        {
            pNew = Aig_ManScl( pTemp, fLatchConst, fLatchEqual, 0, -1, -1, fVerbose, 0 );
            nClasses = Aig_TransferMappedClasses( pAig, pTemp, pMapBack );
            if ( fVerbose )
                printf( "%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d\n",
                        i, Vec_IntSize(vPart), Aig_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Aig_ManNodeNum(pTemp), 0, nClasses );
            Aig_ManStop( pNew );
        }
        Aig_ManStop( pTemp );
        ABC_FREE( pMapBack );
    }
    pNew = Aig_ManDupRepr( pAig, 0 );
    Aig_ManSeqCleanup( pNew );
    Vec_VecFree( (Vec_Vec_t*)vResult );
    return pNew;
}